

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BufferVariableTestGroup::init
          (BufferVariableTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  ContextType type;
  GLSLVersion glslVersion;
  TestCaseGroup *pTVar2;
  Program *pPVar3;
  Shader *pSVar4;
  Node *pNVar5;
  StorageQualifier *pSVar6;
  LayoutQualifier *this_00;
  InterfaceBlock *pIVar7;
  Variable *pVVar8;
  ResourceTestCase *pRVar9;
  ArrayElement *this_01;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar10;
  undefined8 extraout_RAX_01;
  int ndx;
  int iVar11;
  int ndx_1;
  int iVar12;
  bool bVar13;
  SharedPtr buffer;
  SharedPtr variable;
  SharedPtr variable_2;
  SharedPtr bufferStorage;
  SharedPtr defaultBlock;
  SharedPtr shader;
  SharedPtr program;
  SharedPtr binding;
  ProgramResourceQueryTestTarget local_38;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"resource_list","Resource list");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableResourceListBlockContentsProxy);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"array_size","Array size");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"array_stride","Array stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"block_index","Block index");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pPVar3 = (Program *)operator_new(0x28);
  ResourceDefinition::Program::Program(pPVar3,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&program,(Node *)pPVar3);
  pSVar4 = (Shader *)operator_new(0x28);
  ResourceDefinition::Shader::Shader(pSVar4,&program,SHADERTYPE_COMPUTE,glslVersion);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&shader,(Node *)pSVar4);
  pNVar5 = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)pNVar5,&shader);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&defaultBlock,pNVar5);
  pSVar6 = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(pSVar6,&defaultBlock,STORAGE_BUFFER);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&bufferStorage,(Node *)pSVar6);
  this_00 = (LayoutQualifier *)operator_new(0x38);
  glu::Layout::Layout((Layout *)&buffer,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  ResourceDefinition::LayoutQualifier::LayoutQualifier(this_00,&bufferStorage,(Layout *)&buffer);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&binding,(Node *)this_00);
  pIVar7 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar7,&binding,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&buffer,(Node *)pIVar7);
  pVVar8 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar8,&buffer,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pVVar8);
  pRVar9 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&variable_2,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase
            (pRVar9,pCVar1,&variable,(ProgramResourceQueryTestTarget *)&variable_2,"named_block");
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pRVar9);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&buffer);
  pIVar7 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar7,&binding,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&buffer,(Node *)pIVar7);
  pVVar8 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar8,&buffer,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pVVar8);
  pRVar9 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&variable_2,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase
            (pRVar9,pCVar1,&variable,(ProgramResourceQueryTestTarget *)&variable_2,"unnamed_block");
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pRVar9);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&buffer);
  this_01 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this_01,&binding,-1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&buffer,(Node *)this_01);
  pIVar7 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar7,&buffer,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable,(Node *)pIVar7);
  pVVar8 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar8,&variable,TYPE_FLOAT_VEC4);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&variable_2,(Node *)pVVar8);
  pRVar9 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase(pRVar9,pCVar1,&variable_2,&local_38,"block_array");
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)pRVar9);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable_2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&variable);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&buffer);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&binding);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&bufferStorage);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&defaultBlock);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&shader);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&program);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"is_row_major","Is row major");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)64>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"matrix_stride","Matrix stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)128>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"name_length","Name length");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableNameLengthCases);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(this->super_TestCaseGroup).m_context,"offset","Offset");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableOffsetCases);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"referenced_by","Referenced by");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateReferencedByShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableReferencedByBlockContents);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"top_level_array_size",
             "Top-level array size");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)32768>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"top_level_array_stride",
             "Top-level array stride");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)65536>
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(this->super_TestCaseGroup).m_context,"type","Type");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  pPVar3 = (Program *)operator_new(0x28);
  ResourceDefinition::Program::Program(pPVar3,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&buffer,(Node *)pPVar3);
  pSVar4 = (Shader *)operator_new(0x28);
  ResourceDefinition::Shader::Shader(pSVar4,&buffer,SHADERTYPE_COMPUTE,glslVersion);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&program,(Node *)pSVar4);
  pNVar5 = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock((DefaultBlock *)pNVar5,&program);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&shader,pNVar5);
  pSVar6 = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier(pSVar6,&shader,STORAGE_BUFFER);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&defaultBlock,(Node *)pSVar6);
  pIVar7 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar7,&defaultBlock,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&bufferStorage,(Node *)pIVar7);
  generateBufferVariableTypeCases(pCVar1,&bufferStorage,(TestCaseGroup *)pTVar2,3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&bufferStorage);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&defaultBlock);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&shader);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&program);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&buffer);
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup(pTVar2,(this->super_TestCaseGroup).m_context,"random","Random");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  uVar10 = extraout_RAX;
  for (iVar11 = 0; iVar11 != 0x28; iVar11 = iVar11 + 1) {
    generateBufferVariableRandomCase(pCVar1,(TestCaseGroup *)pTVar2,glslVersion,iVar11,false);
    uVar10 = extraout_RAX_00;
  }
  iVar12 = 0;
  iVar11 = 0x28;
  while (bVar13 = iVar11 != 0, iVar11 = iVar11 + -1, bVar13) {
    generateBufferVariableRandomCase(pCVar1,(TestCaseGroup *)pTVar2,glslVersion,iVar12 + 0x28,true);
    iVar12 = iVar12 + 1;
    uVar10 = extraout_RAX_01;
  }
  return (int)uVar10;
}

Assistant:

void BufferVariableTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "resource_list", "Resource list");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableResourceListBlockContentsProxy);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_size", "Array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_stride", "Array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_STRIDE>);
	}

	// .block_index
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "block_index", "Block index");
		addChild(blockGroup);
		generateBufferVariableBlockIndexCases(m_context, glslVersion, blockGroup);
	}

	// .is_row_major
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "is_row_major", "Is row major");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR>);
	}

	// .matrix_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "matrix_stride", "Matrix stride");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_STRIDE>);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "name_length", "Name length");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableNameLengthCases);
	}

	// .offset
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "offset", "Offset");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableOffsetCases);
	}

	// .referenced_by
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "referenced_by", "Referenced by");
		addChild(blockGroup);
		generateReferencedByShaderCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableReferencedByBlockContents);
	}

	// .top_level_array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_size", "Top-level array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE>);
	}

	// .top_level_array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_stride", "Top-level array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_STRIDE>);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "type", "Type");
		addChild(blockGroup);
		generateBufferVariableTypeBlock(m_context, blockGroup, glslVersion);
	}

	// .random
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "random", "Random");
		addChild(blockGroup);
		generateBufferVariableRandomCases(m_context, blockGroup, glslVersion);
	}
}